

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DS_STATUS ds_list_remove_first(DsList *list,void **pdata)

{
  DS_STATUS DVar1;
  
  if ((list != (DsList *)0x0) && (list->entry != (DsListEntry *)0x0)) {
    if (pdata != (void **)0x0) {
      *pdata = list->entry->data;
    }
    list->size = list->size - 1;
    DVar1 = ds_entry_remove(&list->entry);
    return DVar1;
  }
  return DS_STATUS_NULL;
}

Assistant:

DS_STATUS ds_list_remove_first(DsList *list, void **pdata)
{
    if (NULL == list || NULL == list->entry)
        return DS_STATUS_NULL;

    DsListEntry **entry = &list->entry;
    if (NULL != pdata)
        *pdata = (*entry)->data;

    (list->size)--;
    return ds_entry_remove(entry);
}